

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::ast::GenvarSymbol_const*>::
emplace_back<slang::ast::GenvarSymbol_const*const&>
          (SmallVectorBase<slang::ast::GenvarSymbol_const*> *this,GenvarSymbol **args)

{
  long lVar1;
  ulong uVar2;
  void *__dest;
  reference ppGVar3;
  ulong uVar4;
  EVP_PKEY_CTX *__src;
  EVP_PKEY_CTX *ctx;
  
  lVar1 = *(long *)(this + 8);
  __src = (EVP_PKEY_CTX *)(lVar1 * 8 + *(long *)this);
  if (lVar1 != *(long *)(this + 0x10)) {
    *(GenvarSymbol **)__src = *args;
    *(long *)(this + 8) = lVar1 + 1;
    return (reference)(*(long *)this + lVar1 * 8);
  }
  if (*(long *)(this + 8) != 0xfffffffffffffff) {
    uVar4 = *(long *)(this + 8) + 1;
    uVar2 = *(ulong *)(this + 0x10);
    if (uVar4 < uVar2 * 2) {
      uVar4 = uVar2 * 2;
    }
    if (0xfffffffffffffff - uVar2 < uVar2) {
      uVar4 = 0xfffffffffffffff;
    }
    lVar1 = *(long *)this;
    __dest = operator_new(uVar4 * 8);
    ppGVar3 = (reference)((long)__dest + ((long)__src - lVar1));
    *(GenvarSymbol **)((long)__dest + ((long)__src - lVar1)) = *args;
    ctx = *(EVP_PKEY_CTX **)this;
    lVar1 = *(long *)(this + 8);
    if (ctx + (lVar1 * 8 - (long)__src) == (EVP_PKEY_CTX *)0x0) {
      if (lVar1 != 0) {
        memmove(__dest,ctx,lVar1 << 3);
      }
    }
    else {
      if (ctx != __src) {
        memmove(__dest,ctx,(long)__src - (long)ctx);
      }
      memcpy(ppGVar3 + 1,__src,(size_t)(ctx + (lVar1 * 8 - (long)__src)));
      ctx = __src;
    }
    SmallVectorBase<const_slang::ast::GenvarSymbol_*>::cleanup
              ((SmallVectorBase<const_slang::ast::GenvarSymbol_*> *)this,ctx);
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    *(ulong *)(this + 0x10) = uVar4;
    *(void **)this = __dest;
    return ppGVar3;
  }
  detail::throwLengthError();
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }